

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

int traverseproto(global_State *g,Proto *f)

{
  int local_1c;
  int i;
  Proto *f_local;
  global_State *g_local;
  
  if ((f->cache != (LClosure *)0x0) && ((f->cache->marked & 0x18) != 0)) {
    f->cache = (LClosure *)0x0;
  }
  if ((f->source != (TString *)0x0) && ((f->source->marked & 0x18) != 0)) {
    if (9 < (f->source->tt & 0xf)) {
      __assert_fail("(((f->source)->tt) & 0x0F) < (9+1)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x290,"int traverseproto(global_State *, Proto *)");
    }
    reallymarkobject(g,(GCObject *)f->source);
  }
  local_1c = 0;
  do {
    if (f->sizek <= local_1c) {
      local_1c = 0;
      do {
        if (f->sizeupvalues <= local_1c) {
          local_1c = 0;
          do {
            if (f->sizep <= local_1c) {
              local_1c = 0;
              do {
                if (f->sizelocvars <= local_1c) {
                  return f->sizek + 1 + f->sizeupvalues + f->sizep + f->sizelocvars;
                }
                if ((f->locvars[local_1c].varname != (TString *)0x0) &&
                   (((f->locvars[local_1c].varname)->marked & 0x18) != 0)) {
                  if (9 < ((f->locvars[local_1c].varname)->tt & 0xf)) {
                    __assert_fail("(((f->locvars[i].varname)->tt) & 0x0F) < (9+1)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                                  ,0x29a,"int traverseproto(global_State *, Proto *)");
                  }
                  reallymarkobject(g,(GCObject *)f->locvars[local_1c].varname);
                }
                if ((f->locvars[local_1c].usertype != (TString *)0x0) &&
                   (((f->locvars[local_1c].usertype)->marked & 0x18) != 0)) {
                  if (9 < ((f->locvars[local_1c].usertype)->tt & 0xf)) {
                    __assert_fail("(((f->locvars[i].usertype)->tt) & 0x0F) < (9+1)",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                                  ,0x29b,"int traverseproto(global_State *, Proto *)");
                  }
                  reallymarkobject(g,(GCObject *)f->locvars[local_1c].usertype);
                }
                local_1c = local_1c + 1;
              } while( true );
            }
            if ((f->p[local_1c] != (Proto *)0x0) && ((f->p[local_1c]->marked & 0x18) != 0)) {
              if (9 < (f->p[local_1c]->tt & 0xf)) {
                __assert_fail("(((f->p[i])->tt) & 0x0F) < (9+1)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                              ,0x298,"int traverseproto(global_State *, Proto *)");
              }
              reallymarkobject(g,(GCObject *)f->p[local_1c]);
            }
            local_1c = local_1c + 1;
          } while( true );
        }
        if ((f->upvalues[local_1c].name != (TString *)0x0) &&
           (((f->upvalues[local_1c].name)->marked & 0x18) != 0)) {
          if (9 < ((f->upvalues[local_1c].name)->tt & 0xf)) {
            __assert_fail("(((f->upvalues[i].name)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x294,"int traverseproto(global_State *, Proto *)");
          }
          reallymarkobject(g,(GCObject *)f->upvalues[local_1c].name);
        }
        if ((f->upvalues[local_1c].usertype != (TString *)0x0) &&
           (((f->upvalues[local_1c].usertype)->marked & 0x18) != 0)) {
          if (9 < ((f->upvalues[local_1c].usertype)->tt & 0xf)) {
            __assert_fail("(((f->upvalues[i].usertype)->tt) & 0x0F) < (9+1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                          ,0x295,"int traverseproto(global_State *, Proto *)");
          }
          reallymarkobject(g,(GCObject *)f->upvalues[local_1c].usertype);
        }
        local_1c = local_1c + 1;
      } while( true );
    }
    if ((f->k[local_1c].tt_ & 0x8000) != 0) {
      if ((f->k[local_1c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&f->k[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x292,"int traverseproto(global_State *, Proto *)");
      }
      if ((f->k[local_1c].tt_ & 0x7f) != (ushort)(f->k[local_1c].value_.gc)->tt) {
LAB_001262d3:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x292,"int traverseproto(global_State *, Proto *)");
      }
      if (g->mainthread != (lua_State *)0x0) {
        if ((f->k[local_1c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&f->k[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x292,"int traverseproto(global_State *, Proto *)");
        }
        if (((f->k[local_1c].value_.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)
        goto LAB_001262d3;
      }
    }
    if ((f->k[local_1c].tt_ & 0x8000) != 0) {
      if ((f->k[local_1c].tt_ & 0x8000) == 0) {
        __assert_fail("(((&f->k[i])->tt_) & (1 << 15))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                      ,0x292,"int traverseproto(global_State *, Proto *)");
      }
      if (((f->k[local_1c].value_.gc)->marked & 0x18) != 0) {
        if ((f->k[local_1c].tt_ & 0x8000) == 0) {
          __assert_fail("(((&f->k[i])->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                        ,0x292,"int traverseproto(global_State *, Proto *)");
        }
        reallymarkobject(g,f->k[local_1c].value_.gc);
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int traverseproto (global_State *g, Proto *f) {
  int i;
  if (f->cache && iswhite(f->cache))
    f->cache = NULL;  /* allow cache to be collected */
  markobjectN(g, f->source);
  for (i = 0; i < f->sizek; i++)  /* mark literals */
    markvalue(g, &f->k[i]);
  for (i = 0; i < f->sizeupvalues; i++) { /* mark upvalue names */
    markobjectN(g, f->upvalues[i].name);
    markobjectN(g, f->upvalues[i].usertype); /* RAVI change */
  }
  for (i = 0; i < f->sizep; i++) /* mark nested protos */
    markobjectN(g, f->p[i]);
  for (i = 0; i < f->sizelocvars; i++) { /* mark local-variable names */
    markobjectN(g, f->locvars[i].varname);
    markobjectN(g, f->locvars[i].usertype); /* RAVI change */
  }
  return 1 + f->sizek + f->sizeupvalues + f->sizep + f->sizelocvars;
}